

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Talk.cpp
# Opt level: O0

void Handlers::Talk_Announce(Character *character,PacketReader *reader)

{
  World *pWVar1;
  uint uVar2;
  int iVar3;
  time_t tVar4;
  mapped_type *this;
  string local_90;
  allocator<char> local_59;
  key_type local_58;
  undefined1 local_38 [8];
  string message;
  PacketReader *reader_local;
  Character *character_local;
  
  message.field_2._8_8_ = reader;
  uVar2 = (**(character->super_Command_Source)._vptr_Command_Source)();
  if ((1 < (uVar2 & 0xff)) &&
     (iVar3 = character->muted_until, tVar4 = time((time_t *)0x0), iVar3 <= tVar4)) {
    PacketReader::GetEndString_abi_cxx11_((string *)local_38,(PacketReader *)message.field_2._8_8_);
    pWVar1 = character->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"ChatLength",&local_59);
    this = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_58);
    iVar3 = util::variant::operator_cast_to_int(this);
    limit_message((string *)local_38,(long)iVar3);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    pWVar1 = character->world;
    std::__cxx11::string::string((string *)&local_90,(string *)local_38);
    World::AnnounceMsg(pWVar1,&character->super_Command_Source,&local_90,false);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void Talk_Announce(Character *character, PacketReader &reader)
{
	if (character->SourceAccess() < ADMIN_GUARDIAN) return;
	if (character->muted_until > time(0)) return;

	std::string message = reader.GetEndString(); // message
	limit_message(message, static_cast<int>(character->world->config["ChatLength"]));

	character->world->AnnounceMsg(character, message, false);
}